

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t RelativeDate(time_t Start,time_t zone,int dstmode,time_t DayOrdinal,time_t DayNumber)

{
  long local_90;
  undefined1 local_88 [8];
  tm_conflict tmbuf;
  time_t now;
  time_t t;
  tm_conflict *tm;
  time_t DayNumber_local;
  time_t DayOrdinal_local;
  time_t tStack_20;
  int dstmode_local;
  time_t zone_local;
  time_t Start_local;
  
  now = Start - zone;
  tm = (tm_conflict *)DayNumber;
  DayNumber_local = DayOrdinal;
  DayOrdinal_local._4_4_ = dstmode;
  tStack_20 = zone;
  zone_local = Start;
  t = (time_t)gmtime_r(&now,(tm *)local_88);
  if (DayNumber_local < 1) {
    local_90 = DayNumber_local;
  }
  else {
    local_90 = DayNumber_local + -1;
  }
  tmbuf.tm_zone =
       (char *)(local_90 * 0x93a80 +
               (((long)tm + (7 - (long)((tm *)t)->tm_wday)) % 7) * 0x15180 + zone_local);
  if (DayOrdinal_local._4_4_ == 2) {
    Start_local = DSTcorrect(zone_local,(time_t)tmbuf.tm_zone);
  }
  else {
    Start_local = (long)tmbuf.tm_zone - zone_local;
  }
  return Start_local;
}

Assistant:

static time_t
RelativeDate(time_t Start, time_t zone, int dstmode,
    time_t DayOrdinal, time_t DayNumber)
{
	struct tm	*tm;
	time_t	t, now;
#if defined(HAVE_GMTIME_R) || defined(HAVE_GMTIME_S)
	struct tm	tmbuf;
#endif

	t = Start - zone;
#if defined(HAVE_GMTIME_S)
	tm = gmtime_s(&tmbuf, &t) ? NULL : &tmbuf;
#elif defined(HAVE_GMTIME_R)
	tm = gmtime_r(&t, &tmbuf);
#else
	tm = gmtime(&t);
#endif
	now = Start;
	now += DAY * ((DayNumber - tm->tm_wday + 7) % 7);
	now += 7 * DAY * (DayOrdinal <= 0 ? DayOrdinal : DayOrdinal - 1);
	if (dstmode == DSTmaybe)
		return DSTcorrect(Start, now);
	return now - Start;
}